

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcfinal.c
# Opt level: O3

LispPTR findptrsbuffer(LispPTR ptr)

{
  DLword *pDVar1;
  ulong uVar2;
  DLword *pDVar3;
  uint uVar4;
  
  uVar4 = *System_Buffer_List_word;
  pDVar3 = Lisp_world;
  if ((uVar4 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar4);
    pDVar3 = Lisp_world;
  }
  while( true ) {
    pDVar1 = pDVar3 + uVar4;
    if (((ulong)pDVar1 & 1) != 0) {
      printf("Misaligned pointer in LAddrFromNative %p\n",pDVar1);
      pDVar3 = Lisp_world;
    }
    uVar2 = (long)pDVar1 - (long)pDVar3;
    if ((int)(uVar2 >> 1) == 0) break;
    if (*(LispPTR *)(pDVar1 + 2) == ptr) {
      if (((ulong)pDVar1 & 1) != 0) {
        printf("Misaligned pointer in LAddrFromNative %p\n",pDVar1);
        uVar2 = (long)pDVar1 - (long)Lisp_world;
      }
      return (LispPTR)(uVar2 >> 1);
    }
    uVar4 = *(uint *)(pDVar1 + 6) & 0xfffffff;
    if ((*(uint *)(pDVar1 + 6) & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar4);
      pDVar3 = Lisp_world;
    }
  }
  return 0;
}

Assistant:

LispPTR findptrsbuffer(LispPTR ptr) {
  struct buf *bptr;
  bptr = (struct buf *)NativeAligned4FromLAddr(*System_Buffer_List_word);
  while (LAddrFromNative(bptr) != NIL) {
    if (ptr == bptr->vmempage)
      return (LAddrFromNative(bptr));
    else
      bptr = (struct buf *)NativeAligned4FromLAddr(bptr->sysnext);
  }
  return (NIL);
}